

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_AEAD.c
# Opt level: O2

EverCrypt_Error_error_code
EverCrypt_AEAD_encrypt_expand_aes128_gcm_no_check
          (uint8_t *k,uint8_t *iv,uint32_t iv_len,uint8_t *ad,uint32_t ad_len,uint8_t *plain,
          uint32_t plain_len,uint8_t *cipher,uint8_t *tag)

{
  ulong uVar1;
  uint uVar2;
  uint64_t len128x6_;
  ulong uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t tmp_iv [16];
  uint8_t ek [480];
  
  memset(ek,0,0x1e0);
  aes128_key_expansion(k,ek);
  aes128_keyhash_init(ek,ek + 0xb0);
  if (iv_len != 0) {
    tmp_iv[0] = '\0';
    tmp_iv[1] = '\0';
    tmp_iv[2] = '\0';
    tmp_iv[3] = '\0';
    tmp_iv[4] = '\0';
    tmp_iv[5] = '\0';
    tmp_iv[6] = '\0';
    tmp_iv[7] = '\0';
    tmp_iv[8] = '\0';
    tmp_iv[9] = '\0';
    tmp_iv[10] = '\0';
    tmp_iv[0xb] = '\0';
    tmp_iv[0xc] = '\0';
    tmp_iv[0xd] = '\0';
    tmp_iv[0xe] = '\0';
    tmp_iv[0xf] = '\0';
    memcpy(tmp_iv,iv + (iv_len & 0xfffffff0),(ulong)(iv_len & 0xf));
    compute_iv_stdcall(iv,iv_len,iv_len >> 4,tmp_iv,tmp_iv,ek + 0xb0);
    memcpy(ek + 0x130,plain + (plain_len & 0xfffffff0),(ulong)(plain_len & 0xf));
    memcpy(ek + 0x140,ad + (ad_len & 0xfffffff0),(ulong)(ad_len & 0xf));
    uVar2 = plain_len - plain_len % 0x60;
    if (uVar2 < 0x120) {
      uVar3 = (ulong)(plain_len >> 4);
      uVar2 = 0;
      puVar4 = plain;
      puVar5 = cipher;
    }
    else {
      uVar1 = (ulong)uVar2;
      uVar2 = uVar2 >> 4;
      uVar3 = (plain_len & 0xfffffff0) - uVar1 >> 4;
      puVar4 = plain + uVar1;
      puVar5 = cipher + uVar1;
    }
    gcm128_encrypt_opt(ad,ad_len,ad_len >> 4,ek,tmp_iv,ek + 0xb0,ek + 0x140,plain,cipher,uVar2,
                       puVar4,puVar5,uVar3,ek + 0x130,plain_len,ek + 0x150,tag);
    memcpy(cipher + (plain_len & 0xfffffff0),ek + 0x130,(ulong)(plain_len & 0xf));
  }
  return '\0';
}

Assistant:

EverCrypt_Error_error_code
EverCrypt_AEAD_encrypt_expand_aes128_gcm_no_check(
  uint8_t *k,
  uint8_t *iv,
  uint32_t iv_len,
  uint8_t *ad,
  uint32_t ad_len,
  uint8_t *plain,
  uint32_t plain_len,
  uint8_t *cipher,
  uint8_t *tag
)
{
  KRML_MAYBE_UNUSED_VAR(k);
  KRML_MAYBE_UNUSED_VAR(iv);
  KRML_MAYBE_UNUSED_VAR(iv_len);
  KRML_MAYBE_UNUSED_VAR(ad);
  KRML_MAYBE_UNUSED_VAR(ad_len);
  KRML_MAYBE_UNUSED_VAR(plain);
  KRML_MAYBE_UNUSED_VAR(plain_len);
  KRML_MAYBE_UNUSED_VAR(cipher);
  KRML_MAYBE_UNUSED_VAR(tag);
  #if HACL_CAN_COMPILE_VALE
  uint8_t ek[480U] = { 0U };
  uint8_t *keys_b0 = ek;
  uint8_t *hkeys_b0 = ek + 176U;
  aes128_key_expansion(k, keys_b0);
  aes128_keyhash_init(keys_b0, hkeys_b0);
  EverCrypt_AEAD_state_s p = { .impl = Spec_Cipher_Expansion_Vale_AES128, .ek = ek };
  EverCrypt_AEAD_state_s *s = &p;
  if (s == NULL)
  {
    KRML_HOST_IGNORE(EverCrypt_Error_InvalidKey);
  }
  else if (iv_len == 0U)
  {
    KRML_HOST_IGNORE(EverCrypt_Error_InvalidIVLength);
  }
  else
  {
    uint8_t *ek0 = (*s).ek;
    uint8_t *scratch_b = ek0 + 304U;
    uint8_t *ek1 = ek0;
    uint8_t *keys_b = ek1;
    uint8_t *hkeys_b = ek1 + 176U;
    uint8_t tmp_iv[16U] = { 0U };
    uint32_t len = iv_len / 16U;
    uint32_t bytes_len = len * 16U;
    uint8_t *iv_b = iv;
    memcpy(tmp_iv, iv + bytes_len, iv_len % 16U * sizeof (uint8_t));
    compute_iv_stdcall(iv_b, (uint64_t)iv_len, (uint64_t)len, tmp_iv, tmp_iv, hkeys_b);
    uint8_t *inout_b = scratch_b;
    uint8_t *abytes_b = scratch_b + 16U;
    uint8_t *scratch_b1 = scratch_b + 32U;
    uint32_t plain_len_ = (uint32_t)(uint64_t)plain_len / 16U * 16U;
    uint32_t auth_len_ = (uint32_t)(uint64_t)ad_len / 16U * 16U;
    uint8_t *plain_b_ = plain;
    uint8_t *out_b_ = cipher;
    uint8_t *auth_b_ = ad;
    memcpy(inout_b, plain + plain_len_, (uint32_t)(uint64_t)plain_len % 16U * sizeof (uint8_t));
    memcpy(abytes_b, ad + auth_len_, (uint32_t)(uint64_t)ad_len % 16U * sizeof (uint8_t));
    uint64_t len128x6 = (uint64_t)plain_len / 96ULL * 96ULL;
    if (len128x6 / 16ULL >= 18ULL)
    {
      uint64_t len128_num = (uint64_t)plain_len / 16ULL * 16ULL - len128x6;
      uint8_t *in128x6_b = plain_b_;
      uint8_t *out128x6_b = out_b_;
      uint8_t *in128_b = plain_b_ + (uint32_t)len128x6;
      uint8_t *out128_b = out_b_ + (uint32_t)len128x6;
      uint64_t auth_num = (uint64_t)ad_len / 16ULL;
      uint64_t len128x6_ = len128x6 / 16ULL;
      uint64_t len128_num_ = len128_num / 16ULL;
      gcm128_encrypt_opt(auth_b_,
        (uint64_t)ad_len,
        auth_num,
        keys_b,
        tmp_iv,
        hkeys_b,
        abytes_b,
        in128x6_b,
        out128x6_b,
        len128x6_,
        in128_b,
        out128_b,
        len128_num_,
        inout_b,
        (uint64_t)plain_len,
        scratch_b1,
        tag);
    }
    else
    {
      uint32_t len128x61 = 0U;
      uint64_t len128_num = (uint64_t)plain_len / 16ULL * 16ULL;
      uint8_t *in128x6_b = plain_b_;
      uint8_t *out128x6_b = out_b_;
      uint8_t *in128_b = plain_b_ + len128x61;
      uint8_t *out128_b = out_b_ + len128x61;
      uint64_t auth_num = (uint64_t)ad_len / 16ULL;
      uint64_t len128_num_ = len128_num / 16ULL;
      uint64_t len128x6_ = 0ULL;
      gcm128_encrypt_opt(auth_b_,
        (uint64_t)ad_len,
        auth_num,
        keys_b,
        tmp_iv,
        hkeys_b,
        abytes_b,
        in128x6_b,
        out128x6_b,
        len128x6_,
        in128_b,
        out128_b,
        len128_num_,
        inout_b,
        (uint64_t)plain_len,
        scratch_b1,
        tag);
    }
    memcpy(cipher + (uint32_t)(uint64_t)plain_len / 16U * 16U,
      inout_b,
      (uint32_t)(uint64_t)plain_len % 16U * sizeof (uint8_t));
    KRML_HOST_IGNORE(EverCrypt_Error_Success);
  }
  return EverCrypt_Error_Success;
  #else
  KRML_HOST_EPRINTF("KaRaMeL abort at %s:%d\n%s\n",
    __FILE__,
    __LINE__,
    "EverCrypt was compiled on a system which doesn\'t support Vale");
  KRML_HOST_EXIT(255U);
  #endif
}